

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O2

double inspherefast(double *pa,double *pb,double *pc,double *pd,double *pe)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  dVar6 = *pe;
  dVar10 = pe[1];
  dVar4 = pe[2];
  dVar7 = *pa - dVar6;
  dVar8 = *pc - dVar6;
  dVar5 = *pb - dVar6;
  dVar6 = *pd - dVar6;
  dVar11 = pc[1] - dVar10;
  dVar12 = pa[1] - dVar10;
  dVar9 = pb[1] - dVar10;
  dVar10 = pd[1] - dVar10;
  dVar1 = pa[2] - dVar4;
  dVar2 = pc[2] - dVar4;
  dVar3 = pb[2] - dVar4;
  dVar4 = pd[2] - dVar4;
  dVar13 = dVar10 * dVar8 - dVar11 * dVar6;
  dVar14 = dVar7 * dVar9 - dVar12 * dVar5;
  dVar15 = dVar12 * dVar6 - dVar10 * dVar7;
  dVar16 = dVar5 * dVar11 - dVar9 * dVar8;
  dVar18 = dVar7 * dVar11 + -dVar8 * dVar12;
  dVar17 = dVar10 * dVar5 + -dVar6 * dVar9;
  return ((dVar4 * dVar4 + dVar6 * dVar6 + dVar10 * dVar10) *
          (dVar2 * dVar14 + dVar1 * dVar16 + -dVar3 * dVar18) -
         (dVar2 * dVar2 + dVar8 * dVar8 + dVar11 * dVar11) *
         (dVar15 * dVar3 + dVar14 * dVar4 + dVar1 * dVar17)) +
         ((dVar3 * dVar3 + dVar5 * dVar5 + dVar9 * dVar9) *
          (dVar1 * dVar13 + dVar2 * dVar15 + dVar4 * dVar18) -
         (dVar1 * dVar1 + dVar7 * dVar7 + dVar12 * dVar12) *
         (dVar16 * dVar4 + dVar13 * dVar3 + -dVar2 * dVar17));
}

Assistant:

REAL inspherefast(REAL *pa, REAL *pb, REAL *pc, REAL *pd, REAL *pe)
{
  REAL aex, bex, cex, dex;
  REAL aey, bey, cey, dey;
  REAL aez, bez, cez, dez;
  REAL alift, blift, clift, dlift;
  REAL ab, bc, cd, da, ac, bd;
  REAL abc, bcd, cda, dab;

  aex = pa[0] - pe[0];
  bex = pb[0] - pe[0];
  cex = pc[0] - pe[0];
  dex = pd[0] - pe[0];
  aey = pa[1] - pe[1];
  bey = pb[1] - pe[1];
  cey = pc[1] - pe[1];
  dey = pd[1] - pe[1];
  aez = pa[2] - pe[2];
  bez = pb[2] - pe[2];
  cez = pc[2] - pe[2];
  dez = pd[2] - pe[2];

  ab = aex * bey - bex * aey;
  bc = bex * cey - cex * bey;
  cd = cex * dey - dex * cey;
  da = dex * aey - aex * dey;

  ac = aex * cey - cex * aey;
  bd = bex * dey - dex * bey;

  abc = aez * bc - bez * ac + cez * ab;
  bcd = bez * cd - cez * bd + dez * bc;
  cda = cez * da + dez * ac + aez * cd;
  dab = dez * ab + aez * bd + bez * da;

  alift = aex * aex + aey * aey + aez * aez;
  blift = bex * bex + bey * bey + bez * bez;
  clift = cex * cex + cey * cey + cez * cez;
  dlift = dex * dex + dey * dey + dez * dez;

  return (dlift * abc - clift * dab) + (blift * cda - alift * bcd);
}